

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees_emit.h
# Opt level: O3

void zng_tr_emit_end_block(deflate_state *s,ct_data *ltree,int last)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  
  uVar1 = s->bi_valid;
  uVar2 = s->bi_buf;
  uVar3 = 0;
  uVar5 = uVar1 + 7;
  bVar4 = (byte)uVar1;
  if ((uVar5 | uVar1) < 0x40) {
    uVar3 = 0L << (bVar4 & 0x3f) | uVar2;
  }
  else if (uVar1 < 0x40) {
    *(ulong *)(s->pending_buf + s->pending) = 0L << (bVar4 & 0x3f) | uVar2;
    s->pending = s->pending + 8;
    uVar3 = 0L >> (-bVar4 & 0x3f);
    uVar5 = uVar1 - 0x39;
  }
  else {
    *(ulong *)(s->pending_buf + s->pending) = uVar2;
    s->pending = s->pending + 8;
    uVar5 = 7;
  }
  s->bi_valid = uVar5;
  s->bi_buf = uVar3;
  if ((int)ltree != 0) {
    if ((int)uVar5 < 0x39) {
      if (0x18 < (int)uVar5) {
        *(int *)(s->pending_buf + s->pending) = (int)uVar3;
        s->pending = s->pending + 4;
        uVar3 = s->bi_buf >> 0x20;
        s->bi_buf = uVar3;
        uVar5 = s->bi_valid - 0x20;
        s->bi_valid = uVar5;
      }
      if (8 < (int)uVar5) {
        *(short *)(s->pending_buf + s->pending) = (short)uVar3;
        s->pending = s->pending + 2;
        uVar3 = s->bi_buf >> 0x10;
        uVar5 = s->bi_valid - 0x10;
      }
      if (0 < (int)uVar5) {
        uVar5 = s->pending;
        s->pending = uVar5 + 1;
        s->pending_buf[uVar5] = (uchar)uVar3;
      }
    }
    else {
      *(ulong *)(s->pending_buf + s->pending) = uVar3;
      s->pending = s->pending + 8;
    }
    s->bi_buf = 0;
    s->bi_valid = 0;
  }
  return;
}

Assistant:

static inline void zng_emit_end_block(deflate_state *s, const ct_data *ltree, const int last) {
    uint32_t bi_valid = s->bi_valid;
    uint64_t bi_buf = s->bi_buf;
    send_code(s, END_BLOCK, ltree, bi_buf, bi_valid);
    s->bi_valid = bi_valid;
    s->bi_buf = bi_buf;
    Tracev((stderr, "\n+++ Emit End Block: Last: %u Pending: %u Total Out: %" PRIu64 "\n",
        last, s->pending, (uint64_t)s->strm->total_out));
    Z_UNUSED(last);
}